

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::TransRangeSyntax::setChild(TransRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar3;
  TransRepeatRangeSyntax *pTVar4;
  logic_error *this_00;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 1) {
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar2 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pTVar4 = (TransRepeatRangeSyntax *)0x0;
    }
    else {
      ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pTVar4 = (TransRepeatRangeSyntax *)*ppSVar2;
      if ((pTVar4->super_SyntaxNode).kind != TransRepeatRange) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,
                   "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::TransRepeatRangeSyntax]")
        ;
      }
    }
    this->repeat = pTVar4;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
                 ,"");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_d0);
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar5[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
      }
      local_b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::to_string(&local_70,0x326d);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_90 == plVar7) {
        local_80 = *plVar7;
        lStack_78 = plVar5[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar7;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_f0 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_f0 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar7;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_f0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (*ppSVar2);
    (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->items).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
    sVar1 = (pSVar3->elements).size_;
    (this->items).elements.data_ = (pSVar3->elements).data_;
    (this->items).elements.size_ = sVar1;
  }
  return;
}

Assistant:

void TransRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: repeat = child.node() ? &child.node()->as<TransRepeatRangeSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}